

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_usage(string *__return_storage_ptr__,Formatter *this,App *app,string *name)

{
  ostream *poVar1;
  size_t sVar2;
  string *delim;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positional_names;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> positionals;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> non_pos_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  _Any_data local_308;
  code *local_2f8;
  code *local_2f0;
  string *local_2e8;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_2e0;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2c8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2b0;
  _Any_data local_298;
  code *local_288;
  code *local_280;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  string local_250;
  undefined1 local_230 [32];
  string local_210;
  string local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_2e8 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Usage","");
  FormatterBase::get_label((string *)&local_308,&this->super_FormatterBase,&local_1f0);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_308._M_unused._0_8_,local_308._8_8_);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  bVar5 = name->_M_string_length != 0;
  pcVar3 = "\n  ";
  pcVar4 = "";
  if (!bVar5) {
    pcVar3 = "\n\n";
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3 + 2,(ulong)bVar5);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  if ((code **)local_308._M_unused._0_8_ != &local_2f8) {
    operator_delete(local_308._M_unused._M_object);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  App::get_groups_abi_cxx11_(&local_1d0,app);
  local_278._M_unused._M_object = (void *)0x0;
  local_278._8_8_ = 0;
  local_260 = std::
              _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/CLI11.hpp:6598:26)>
              ::_M_invoke;
  local_268 = std::
              _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/CLI11.hpp:6598:26)>
              ::_M_manager;
  App::get_options(&local_2b0,app,(function<bool_(const_CLI::Option_*)> *)&local_278);
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,__destroy_functor);
  }
  if (local_2b0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_2b0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [",2);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"OPTIONS","");
    FormatterBase::get_label((string *)&local_308,&this->super_FormatterBase,&local_210);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_308._M_unused._0_8_,local_308._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
    if ((code **)local_308._M_unused._0_8_ != &local_2f8) {
      operator_delete(local_308._M_unused._M_object);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  local_298._M_unused._M_object = (void *)0x0;
  local_298._8_8_ = 0;
  local_280 = std::
              _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/CLI11.hpp:6603:64)>
              ::_M_invoke;
  local_288 = std::
              _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/CLI11.hpp:6603:64)>
              ::_M_manager;
  App::get_options(&local_2c8,app,(function<bool_(const_CLI::Option_*)> *)&local_298);
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,__destroy_functor);
  }
  if (local_2c8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_2c8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2e0,
             (long)local_2c8.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_2c8.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)local_308._M_pod_data);
    delim = (string *)this;
    ::std::
    transform<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_3_>
              ((__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                )local_2c8.
                 super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                )local_2c8.
                 super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_2e0.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,(anon_class_8_1_8991fb9c)this);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    local_230._0_8_ = (pointer)(local_230 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_230," ","");
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&local_308,(detail *)&local_2e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_230,delim);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_308._M_unused._0_8_,local_308._8_8_);
    if ((code **)local_308._M_unused._0_8_ != &local_2f8) {
      operator_delete(local_308._M_unused._M_object);
    }
    if ((pointer)local_230._0_8_ != (pointer)(local_230 + 0x10)) {
      operator_delete((void *)local_230._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2e0);
  }
  local_308._M_unused._M_object = (code **)0x0;
  local_308._8_8_ = 0;
  local_2f0 = std::
              _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/CLI11.hpp:6618:16)>
              ::_M_invoke;
  local_2f8 = std::
              _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/CLI11.hpp:6618:16)>
              ::_M_manager;
  App::get_subcommands(&local_2e0,app,(function<bool_(const_CLI::App_*)> *)&local_308);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_2e0.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_2e0.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2f8 != (code *)0x0) {
    (*local_2f8)(&local_308,&local_308,3);
  }
  if (local_2e0.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2e0.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    bVar5 = app->require_subcommand_min_ == 0;
    pcVar3 = "[";
    if (!bVar5) {
      pcVar3 = "";
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,(ulong)bVar5);
    if (app->require_subcommand_max_ < 2) {
      pcVar3 = "SUBCOMMAND";
    }
    else {
      pcVar3 = "SUBCOMMANDS";
      if (1 < app->require_subcommand_min_) {
        pcVar3 = "SUBCOMMAND";
      }
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    sVar2 = strlen(pcVar3);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,pcVar3,pcVar3 + sVar2);
    FormatterBase::get_label((string *)&local_308,&this->super_FormatterBase,&local_250);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_308._M_unused._0_8_,local_308._8_8_);
    bVar5 = app->require_subcommand_min_ == 0;
    if (bVar5) {
      pcVar4 = "]";
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,(ulong)bVar5);
    if ((code **)local_308._M_unused._0_8_ != &local_2f8) {
      operator_delete(local_308._M_unused._M_object);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
  }
  ::std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
  ::std::ostream::put((char)local_1a8);
  ::std::ostream::flush();
  ::std::__cxx11::stringbuf::str();
  if (local_2c8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (Option **)0x0) {
    operator_delete(local_2c8.
                    super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.
                    super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return local_2e8;
}

Assistant:

inline std::string Formatter::make_usage(const App *app, std::string name) const {
    std::stringstream out;

    out << get_label("Usage") << ":" << (name.empty() ? "" : " ") << name;

    std::vector<std::string> groups = app->get_groups();

    // Print an Options badge if any options exist
    std::vector<const Option *> non_pos_options =
        app->get_options([](const Option *opt) { return opt->nonpositional(); });
    if(!non_pos_options.empty())
        out << " [" << get_label("OPTIONS") << "]";

    // Positionals need to be listed here
    std::vector<const Option *> positionals = app->get_options([](const Option *opt) { return opt->get_positional(); });

    // Print out positionals if any are left
    if(!positionals.empty()) {
        // Convert to help names
        std::vector<std::string> positional_names(positionals.size());
        std::transform(positionals.begin(), positionals.end(), positional_names.begin(), [this](const Option *opt) {
            return make_option_usage(opt);
        });

        out << " " << detail::join(positional_names, " ");
    }

    // Add a marker if subcommands are expected or optional
    if(!app->get_subcommands(
               [](const CLI::App *subc) { return ((!subc->get_disabled()) && (!subc->get_name().empty())); })
            .empty()) {
        out << " " << (app->get_require_subcommand_min() == 0 ? "[" : "")
            << get_label(app->get_require_subcommand_max() < 2 || app->get_require_subcommand_min() > 1 ? "SUBCOMMAND"
                                                                                                        : "SUBCOMMANDS")
            << (app->get_require_subcommand_min() == 0 ? "]" : "");
    }

    out << std::endl;

    return out.str();
}